

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O3

Allocation __thiscall
density::heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>::
inplace_allocate<0ul,true,2ul,2ul>
          (heter_queue<density::runtime_type<>,density_tests::UnmovableFastTestAllocator<256ul>>
           *this)

{
  ControlBlock *pCVar1;
  ControlBlock *pCVar2;
  uintptr_t uint_pointer_1;
  uintptr_t uint_pointer;
  Allocation AVar3;
  
  if (*(ulong *)(this + 0x38) != 0xef && (*(ulong *)(this + 0x38) & 7) != 0) {
    density_tests::detail::assert_failed<>
              ("address_is_aligned(m_tail, min_alignment) || m_tail == reinterpret_cast<ControlBlock *>(s_invalid_control_block)"
               ,
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
               ,0xac8);
  }
  while( true ) {
    pCVar2 = *(ControlBlock **)(this + 0x38);
    if (pCVar2 != (ControlBlock *)0xef && ((ulong)pCVar2 & 7) != 0) {
      density_tests::detail::assert_failed<>
                ("address_is_aligned(new_tail, min_alignment) || m_tail == reinterpret_cast<ControlBlock *>(s_invalid_control_block)"
                 ,
                 "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/include/density/heter_queue.h"
                 ,0xae0);
    }
    pCVar1 = pCVar2 + 3;
    if (pCVar1 <= (ControlBlock *)((ulong)pCVar2 & 0xffffffffffffff00 | 0xe8)) break;
    heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>::
    allocate_new_page((heter_queue<density::runtime_type<>,_density_tests::UnmovableFastTestAllocator<256UL>_>
                       *)this);
  }
  pCVar2->m_next = (uintptr_t)pCVar1;
  *(ControlBlock **)(this + 0x38) = pCVar1;
  AVar3.m_user_storage = pCVar2 + 2;
  AVar3.m_control_block = pCVar2;
  return AVar3;
}

Assistant:

Allocation inplace_allocate()
        {
            static_assert(is_power_of_2(ALIGNMENT) && (SIZE % ALIGNMENT) == 0, "");

            DENSITY_ASSERT_INTERNAL(
              address_is_aligned(m_tail, min_alignment) ||
              m_tail == reinterpret_cast<ControlBlock *>(s_invalid_control_block));

            constexpr size_t alignment = detail::size_max(ALIGNMENT, min_alignment);
            constexpr size_t size      = uint_upper_align(SIZE, alignment);
            constexpr bool   can_fit_in_a_page =
              size + (alignment - min_alignment) <= s_max_size_inpage;
            constexpr bool over_aligned = alignment > min_alignment;

            for (;;)
            {
                // allocate space for the control block and the runtime type
                auto const control_block = m_tail;
                void *     new_tail      = address_add(
                  control_block,
                  INCLUDE_TYPE ? (s_sizeof_ControlBlock + s_sizeof_RuntimeType)
                               : s_sizeof_ControlBlock);

                // allocate space for the element
                if (over_aligned)
                {
                    new_tail = address_upper_align(new_tail, alignment);
                }
                DENSITY_ASSERT_INTERNAL(
                  address_is_aligned(new_tail, min_alignment) ||
                  m_tail == reinterpret_cast<ControlBlock *>(s_invalid_control_block));
                void * new_element = new_tail;
                new_tail           = address_add(new_tail, size);

                // check if a page overflow would occur
                void * end_of_page = get_end_of_page(control_block);
                if (DENSITY_LIKELY(new_tail <= end_of_page))
                {
                    DENSITY_ASSUME(control_block != nullptr);
                    new (control_block) ControlBlock();

                    control_block->m_next = reinterpret_cast<uintptr_t>(new_tail) + CONTROL_BITS;
                    m_tail                = static_cast<ControlBlock *>(new_tail);
                    return Allocation{control_block, new_element};
                }
                else if (can_fit_in_a_page)
                {
                    // allocate a new page and redo
                    allocate_new_page();
                }
                else
                {
                    // this allocation would never fit in a page, allocate an external block
                    return external_allocate<CONTROL_BITS>(size, alignment);
                }
            }
        }